

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

iterator divsufsortxx::helper::
         median5<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                   (iterator Td,iterator v1,iterator v2,iterator v3,iterator v4,iterator v5)

{
  BitmapArray<long> *pBVar1;
  pos_type pVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  BitmapArray<long> *pBVar7;
  pos_type pVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  long lVar11;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  pos_type pVar12;
  BitmapArray<long> *pBVar13;
  pos_type pVar14;
  BitmapArray<long> *pBVar15;
  iterator *piVar16;
  pos_type local_60;
  BitmapArray<long> *local_58;
  
  pVar14 = Td.pos_;
  pBVar15 = Td.array_;
  local_60 = v2.pos_;
  local_58 = v2.array_;
  pVar12 = v1.pos_;
  pBVar13 = v1.array_;
  iVar9 = (*(local_58->super_Bitmap)._vptr_Bitmap[5])(local_58,local_60);
  iVar9 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,CONCAT44(extraout_var,iVar9) + pVar14);
  pBVar1 = (BitmapArray<long> *)CONCAT44(v3.array_._4_4_,v3.array_._0_4_);
  pVar2 = CONCAT44(v3.pos_._4_4_,(undefined4)v3.pos_);
  iVar10 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])();
  iVar10 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                     (pBVar15,CONCAT44(extraout_var_01,iVar10) + pVar14);
  pVar8 = v4.pos_;
  pBVar7 = v4.array_;
  if (CONCAT44(extraout_var_02,iVar10) < CONCAT44(extraout_var_00,iVar9)) {
    v3.array_._0_4_ = v2.array_._0_4_;
    v3.array_._4_4_ = v2.array_._4_4_;
    v3.pos_._0_4_ = (undefined4)v2.pos_;
    v3.pos_._4_4_ = v2.pos_._4_4_;
    local_60 = pVar2;
    local_58 = pBVar1;
  }
  iVar9 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_);
  iVar9 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                    (pBVar15,CONCAT44(extraout_var_03,iVar9) + pVar14);
  pBVar1 = v5.array_;
  pVar2 = v5.pos_;
  iVar10 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,pVar2);
  iVar10 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                     (pBVar15,CONCAT44(extraout_var_05,iVar10) + pVar14);
  if (CONCAT44(extraout_var_06,iVar10) < CONCAT44(extraout_var_04,iVar9)) {
    v5.array_._0_4_ = SUB84(pBVar7,0);
    v5.array_._4_4_ = (undefined4)((ulong)pBVar7 >> 0x20);
    v5.pos_._0_4_ = (undefined4)pVar8;
    v5.pos_._4_4_ = (undefined4)(pVar8 >> 0x20);
    v4.array_ = pBVar1;
    v4.pos_ = pVar2;
  }
  iVar9 = (*(local_58->super_Bitmap)._vptr_Bitmap[5])(local_58,local_60);
  iVar9 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                    (pBVar15,CONCAT44(extraout_var_07,iVar9) + pVar14);
  iVar10 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar10 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                     (pBVar15,CONCAT44(extraout_var_09,iVar10) + pVar14);
  uVar6 = v3.pos_._4_4_;
  uVar5 = (undefined4)v3.pos_;
  uVar4 = v3.array_._4_4_;
  uVar3 = v3.array_._0_4_;
  if (CONCAT44(extraout_var_10,iVar10) < CONCAT44(extraout_var_08,iVar9)) {
    v4.array_ = local_58;
    v4.pos_ = local_60;
    v3.array_._0_4_ = v5.array_._0_4_;
    v3.array_._4_4_ = v5.array_._4_4_;
    v3.pos_._0_4_ = (undefined4)v5.pos_;
    v3.pos_._4_4_ = v5.pos_._4_4_;
    v5.array_._0_4_ = uVar3;
    v5.array_._4_4_ = uVar4;
    v5.pos_._0_4_ = uVar5;
    v5.pos_._4_4_ = uVar6;
  }
  iVar9 = (*(pBVar13->super_Bitmap)._vptr_Bitmap[5])(pBVar13,pVar12);
  iVar9 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                    (pBVar15,CONCAT44(extraout_var_11,iVar9) + pVar14);
  pBVar1 = (BitmapArray<long> *)CONCAT44(v3.array_._4_4_,v3.array_._0_4_);
  pVar2 = CONCAT44(v3.pos_._4_4_,(undefined4)v3.pos_);
  iVar10 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1);
  iVar10 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                     (pBVar15,CONCAT44(extraout_var_13,iVar10) + pVar14);
  if (CONCAT44(extraout_var_14,iVar10) < CONCAT44(extraout_var_12,iVar9)) {
    v3.array_._0_4_ = v1.array_._0_4_;
    v3.array_._4_4_ = v1.array_._4_4_;
    v3.pos_._0_4_ = (undefined4)v1.pos_;
    v3.pos_._4_4_ = v1.pos_._4_4_;
    pVar12 = pVar2;
    pBVar13 = pBVar1;
  }
  iVar9 = (*(pBVar13->super_Bitmap)._vptr_Bitmap[5])(pBVar13,pVar12);
  iVar9 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                    (pBVar15,CONCAT44(extraout_var_15,iVar9) + pVar14);
  iVar10 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar10 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                     (pBVar15,CONCAT44(extraout_var_17,iVar10) + pVar14);
  if (CONCAT44(extraout_var_18,iVar10) < CONCAT44(extraout_var_16,iVar9)) {
    v3.array_._0_4_ = v5.array_._0_4_;
    v3.array_._4_4_ = v5.array_._4_4_;
    v3.pos_._0_4_ = (undefined4)v5.pos_;
    v3.pos_._4_4_ = v5.pos_._4_4_;
    v4.array_ = pBVar13;
    v4.pos_ = pVar12;
  }
  lVar11 = (**(code **)(*(long *)CONCAT44(v3.array_._4_4_,v3.array_._0_4_) + 0x28))
                     ((long *)CONCAT44(v3.array_._4_4_,v3.array_._0_4_),
                      CONCAT44(v3.pos_._4_4_,(undefined4)v3.pos_));
  iVar9 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,lVar11 + pVar14);
  iVar10 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar10 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])
                     (pBVar15,pVar14 + CONCAT44(extraout_var_20,iVar10));
  piVar16 = &v3;
  if (CONCAT44(extraout_var_21,iVar10) < CONCAT44(extraout_var_19,iVar9)) {
    piVar16 = &v4;
  }
  return *piVar16;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}